

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O3

string * __thiscall
clickhouse::ColumnEnum<short>::NameAt_abi_cxx11_
          (string *__return_storage_ptr__,ColumnEnum<short> *this,size_t n)

{
  pointer psVar1;
  pointer pcVar2;
  string *psVar3;
  EnumType EStack_28;
  
  EnumType::EnumType(&EStack_28,&(this->super_Column).type_);
  psVar1 = (this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (n < (ulong)((long)(this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)psVar1 >> 1)) {
    psVar3 = EnumType::GetEnumName_abi_cxx11_(&EStack_28,psVar1[n]);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar3->_M_string_length);
    if (EStack_28.type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (EStack_28.type_.super___shared_ptr<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",n);
}

Assistant:

const std::string ColumnEnum<T>::NameAt(size_t n) const {
    return EnumType(type_).GetEnumName(data_.at(n));
}